

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1806.cpp
# Opt level: O2

void dcstr(int x)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int *piVar5;
  priority_queue<pp,_std::vector<pp,_std::allocator<pp>_>,_std::less<pp>_> pq;
  value_type local_60;
  priority_queue<pp,_std::vector<pp,_std::allocator<pp>_>,_std::less<pp>_> local_58;
  
  local_58.c.super__Vector_base<pp,_std::allocator<pp>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_58.c.super__Vector_base<pp,_std::allocator<pp>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_58.c.super__Vector_base<pp,_std::allocator<pp>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  dis[x] = 0;
  local_60.d = 0;
  local_60.u = x;
  std::priority_queue<pp,_std::vector<pp,_std::allocator<pp>_>,_std::less<pp>_>::push
            (&local_58,&local_60);
  while (local_58.c.super__Vector_base<pp,_std::allocator<pp>_>._M_impl.super__Vector_impl_data.
         _M_start !=
         local_58.c.super__Vector_base<pp,_std::allocator<pp>_>._M_impl.super__Vector_impl_data.
         _M_finish) {
    iVar1 = (local_58.c.super__Vector_base<pp,_std::allocator<pp>_>._M_impl.super__Vector_impl_data.
            _M_start)->u;
    std::priority_queue<pp,_std::vector<pp,_std::allocator<pp>_>,_std::less<pp>_>::pop(&local_58);
    if (vis[iVar1] == false) {
      vis[iVar1] = true;
      piVar5 = head + iVar1;
      while (lVar3 = (long)*piVar5, lVar3 != -1) {
        iVar2 = edge[lVar3].v;
        iVar4 = edge[lVar3].w + dis[iVar1];
        if (iVar4 < dis[iVar2]) {
          par[iVar2] = iVar1;
          dis[iVar2] = iVar4;
          local_60.d = iVar4;
          local_60.u = iVar2;
          std::priority_queue<pp,_std::vector<pp,_std::allocator<pp>_>,_std::less<pp>_>::push
                    (&local_58,&local_60);
        }
        piVar5 = &edge[lVar3].next;
      }
    }
  }
  std::_Vector_base<pp,_std::allocator<pp>_>::~_Vector_base
            ((_Vector_base<pp,_std::allocator<pp>_> *)&local_58);
  return;
}

Assistant:

void dcstr(int x){
    std::priority_queue<pp> pq;
    dis[x] = 0;
    pq.push({dis[x], x});
    while (!pq.empty()){
        int u = pq.top().u;
        pq.pop();
        if (vis[u]) {
            continue;
        }
        vis[u] = true;
        for (int i = head[u]; i != -1 ; i = edge[i].next) {
            int v = edge[i].v;
            if (dis[v] > dis[u] + edge[i].w){
                par[v] = u;
                dis[v] = dis[u] + edge[i].w;
                pq.push({dis[v], v});
            }
        }
    }
}